

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

char * catstr(char *a,char *b)

{
  size_t sVar1;
  size_t sVar2;
  char *in_RSI;
  char *in_RDI;
  char *res;
  char *local_8;
  
  local_8 = in_RSI;
  if (in_RDI != (char *)0x0) {
    sVar1 = strlen(in_RDI);
    sVar2 = strlen(in_RSI);
    local_8 = (char *)malloc(sVar1 + sVar2 + 2);
    strcpy(local_8,in_RDI);
    strcat(local_8,"_");
    strcat(local_8,in_RSI);
  }
  return local_8;
}

Assistant:

static char *catstr (char *a, char *b) {
	if (!a)
		return b;
	char *res = malloc (strlen(a) + strlen(b) + 2);
	strcpy(res, a);
	strcat(res, "_");
	strcat(res, b);
	return res;
}